

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::PairwiseRankLoss::dim_forward
          (Dim *__return_storage_ptr__,PairwiseRankLoss *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  Dim *a;
  pointer pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  ostream *os;
  invalid_argument *this_00;
  pointer pDVar6;
  string local_1b0 [32];
  ostringstream s;
  
  a = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.super__Vector_impl_data.
      _M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)a == 0x48) {
    bVar5 = operator!=(a,a + 1);
    if (((!bVar5) &&
        (pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                  super__Vector_impl_data._M_start, pDVar1->d[0] == 1)) && (pDVar1->nd - 1 < 2)) {
      pDVar6 = pDVar1 + 1;
      if (pDVar1[1].bd <= pDVar1->bd) {
        pDVar6 = pDVar1;
      }
      __return_storage_ptr__->bd = pDVar6->bd;
      uVar2 = *(undefined8 *)(pDVar6->d + 2);
      uVar3 = *(undefined8 *)(pDVar6->d + 4);
      uVar4 = *(undefined8 *)(pDVar6->d + 6);
      *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar6->d;
      *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar2;
      *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar3;
      *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar4;
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  os = std::operator<<((ostream *)&s,"Bad input dimensions in PairwiseRankLoss: ");
  operator<<(os,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim PairwiseRankLoss::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 ||
      xs[0] != xs[1] ||
      xs[0].rows() != 1 ||
      (xs[0].ndims() != 1 && xs[0].ndims() != 2)) {
    ostringstream s; s << "Bad input dimensions in PairwiseRankLoss: " << xs;
    throw std::invalid_argument(s.str());
  }
  return xs[0].bd >= xs[1].bd ? xs[0] : xs[1];
}